

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam_mono.cpp
# Opt level: O0

void InitRectifyMap(Mat *K,Mat *D,Mat *Knew,double xi,Size *size,RectMode mode,Mat *map1,Mat *map2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double *pdVar10;
  float *pfVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double v;
  double u;
  double yd;
  double xd;
  double r4;
  double r2;
  double yu;
  double xu;
  double zs;
  double ys;
  double xs;
  double rr;
  double local_5c0;
  double pp_1;
  double local_558;
  double tt_1;
  double zz;
  double local_4e8;
  double ff;
  double local_480;
  double ee;
  double local_418;
  double pp;
  double local_3b0;
  double tt;
  Mat local_348 [96];
  Mat local_2e8 [96];
  double local_288;
  double zc;
  double yc;
  double xc;
  int local_268;
  int c;
  int r;
  MatExpr local_258 [352];
  MatExpr local_f8 [8];
  Mat Ki;
  double p2;
  double p1;
  double k2;
  double k1;
  double s;
  double cy;
  double cx;
  double fy;
  double fx;
  Size_<int> local_48;
  Mat *local_40;
  Mat *map1_local;
  Size *pSStack_30;
  RectMode mode_local;
  Size *size_local;
  double xi_local;
  Mat *Knew_local;
  Mat *D_local;
  Mat *K_local;
  
  local_40 = map1;
  map1_local._4_4_ = mode;
  pSStack_30 = size;
  size_local = (Size *)xi;
  xi_local = (double)Knew;
  Knew_local = D;
  D_local = K;
  cv::Size_<int>::Size_(&local_48,size);
  cv::Mat::create(map1,&local_48);
  cv::Size_<int>::Size_((Size_<int> *)&fx,size);
  cv::Mat::create(map2,(Size_<int> *)&fx,5);
  pdVar10 = cv::Mat::at<double>(K,0,0);
  dVar1 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(K,1,1);
  dVar2 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(K,0,2);
  dVar3 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(K,1,2);
  dVar4 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(K,0,1);
  dVar5 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(D,0,0);
  dVar6 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(D,0,1);
  dVar7 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(D,0,2);
  dVar8 = *pdVar10;
  pdVar10 = cv::Mat::at<double>(D,0,3);
  dVar9 = *pdVar10;
  cv::Mat::inv((int)local_258);
  cv::MatExpr::operator_cast_to_Mat(local_f8);
  cv::MatExpr::~MatExpr(local_258);
  local_268 = 0;
  do {
    if (size->height <= local_268) {
      cv::Mat::~Mat((Mat *)local_f8);
      return;
    }
    for (xc._4_4_ = 0; xc._4_4_ < size->width; xc._4_4_ = xc._4_4_ + 1) {
      yc = 0.0;
      zc = 0.0;
      local_288 = 0.0;
      if (map1_local._4_4_ == RECT_PERSPECTIVE) {
        cv::Mat::Mat(local_2e8,(Mat *)local_f8);
        yc = MatRowMul(local_2e8,(double)xc._4_4_,(double)local_268,1.0,0);
        cv::Mat::~Mat(local_2e8);
        cv::Mat::Mat(local_348,(Mat *)local_f8);
        zc = MatRowMul(local_348,(double)xc._4_4_,(double)local_268,1.0,1);
        cv::Mat::~Mat(local_348);
        cv::Mat::Mat((Mat *)&tt,(Mat *)local_f8);
        local_288 = MatRowMul((Mat *)&tt,(double)xc._4_4_,(double)local_268,1.0,2);
        cv::Mat::~Mat((Mat *)&tt);
      }
      if (map1_local._4_4_ == RECT_CYLINDRICAL) {
        cv::Mat::Mat((Mat *)&pp,(Mat *)local_f8);
        dVar12 = MatRowMul((Mat *)&pp,(double)xc._4_4_,(double)local_268,1.0,0);
        cv::Mat::~Mat((Mat *)&pp);
        local_3b0 = dVar12;
        cv::Mat::Mat((Mat *)&ee,(Mat *)local_f8);
        dVar12 = MatRowMul((Mat *)&ee,(double)xc._4_4_,(double)local_268,1.0,1);
        cv::Mat::~Mat((Mat *)&ee);
        local_418 = dVar12 + 0.2617993877991494;
        dVar12 = sin(dVar12 + 0.2617993877991494);
        dVar13 = cos(local_3b0);
        yc = -dVar12 * dVar13;
        dVar12 = cos(local_418);
        zc = -dVar12;
        dVar12 = sin(local_418);
        local_288 = sin(local_3b0);
        local_288 = dVar12 * local_288;
      }
      if (map1_local._4_4_ == RECT_FISHEYE) {
        dVar13 = (double)xc._4_4_;
        pdVar10 = cv::Mat::at<double>(Knew,0,2);
        dVar12 = *pdVar10;
        dVar14 = (double)local_268;
        pdVar10 = cv::Mat::at<double>(Knew,1,2);
        dVar12 = hypot(dVar13 - dVar12,dVar14 - *pdVar10);
        pdVar10 = cv::Mat::at<double>(Knew,0,0);
        if (dVar12 < *pdVar10 || dVar12 == *pdVar10) {
          cv::Mat::Mat((Mat *)&ff,(Mat *)local_f8);
          dVar12 = MatRowMul((Mat *)&ff,(double)xc._4_4_,(double)local_268,1.0,0);
          cv::Mat::~Mat((Mat *)&ff);
          local_480 = dVar12;
          cv::Mat::Mat((Mat *)&zz,(Mat *)local_f8);
          dVar12 = MatRowMul((Mat *)&zz,(double)xc._4_4_,(double)local_268,1.0,1);
          cv::Mat::~Mat((Mat *)&zz);
          tt_1 = 2.0 / (local_480 * local_480 + dVar12 * dVar12 + 1.0);
          yc = tt_1 * local_480;
          zc = tt_1 * dVar12;
          local_288 = tt_1 - 1.0;
          local_4e8 = dVar12;
          goto LAB_00107458;
        }
        pfVar11 = cv::Mat::at<float>(local_40,local_268,xc._4_4_);
        *pfVar11 = -1.0;
        pfVar11 = cv::Mat::at<float>(map2,local_268,xc._4_4_);
        *pfVar11 = -1.0;
      }
      else {
LAB_00107458:
        if (map1_local._4_4_ == RECT_LONGLAT) {
          cv::Mat::Mat((Mat *)&pp_1,(Mat *)local_f8);
          dVar12 = MatRowMul((Mat *)&pp_1,(double)xc._4_4_,(double)local_268,1.0,0);
          cv::Mat::~Mat((Mat *)&pp_1);
          local_558 = dVar12;
          cv::Mat::Mat((Mat *)&rr,(Mat *)local_f8);
          dVar12 = MatRowMul((Mat *)&rr,(double)xc._4_4_,(double)local_268,1.0,1);
          cv::Mat::~Mat((Mat *)&rr);
          local_5c0 = dVar12;
          dVar12 = cos(local_558);
          yc = -dVar12;
          dVar12 = sin(local_558);
          dVar13 = cos(local_5c0);
          zc = -dVar12 * dVar13;
          dVar12 = sin(local_558);
          local_288 = sin(local_5c0);
          local_288 = dVar12 * local_288;
        }
        dVar12 = sqrt(local_288 * local_288 + yc * yc + zc * zc);
        dVar13 = (yc / dVar12) / (local_288 / dVar12 + (double)size_local);
        dVar12 = (zc / dVar12) / (local_288 / dVar12 + (double)size_local);
        dVar14 = dVar13 * dVar13 + dVar12 * dVar12;
        dVar15 = dVar8 * ((dVar12 + dVar12) * dVar12 + dVar14) +
                 (dVar7 * dVar14 * dVar14 + dVar6 * dVar14 + 1.0) * dVar12 +
                 (dVar9 + dVar9) * dVar13 * dVar12;
        pfVar11 = cv::Mat::at<float>(local_40,local_268,xc._4_4_);
        *pfVar11 = (float)(dVar1 * (dVar9 * ((dVar13 + dVar13) * dVar13 + dVar14) +
                                   (dVar7 * dVar14 * dVar14 + dVar6 * dVar14 + 1.0) * dVar13 +
                                   (dVar8 + dVar8) * dVar13 * dVar12) + dVar5 * dVar15 + dVar3);
        pfVar11 = cv::Mat::at<float>(map2,local_268,xc._4_4_);
        *pfVar11 = (float)(dVar2 * dVar15 + dVar4);
      }
    }
    local_268 = local_268 + 1;
  } while( true );
}

Assistant:

void InitRectifyMap(cv::Mat K,
                    cv::Mat D,
                    cv::Mat Knew,
                    double xi,
                    cv::Size size,
                    RectMode mode,
                    cv::Mat& map1,
                    cv::Mat& map2) {
  map1.create(size, CV_32F);
  map2.create(size, CV_32F);

  double fx = K.at<double>(0,0);
  double fy = K.at<double>(1,1);
  double cx = K.at<double>(0,2);
  double cy = K.at<double>(1,2);
  double s  = K.at<double>(0,1);

  double k1 = D.at<double>(0,0);
  double k2 = D.at<double>(0,1);
  double p1 = D.at<double>(0,2);
  double p2 = D.at<double>(0,3);

  cv::Mat Ki  = Knew.inv();

  for (int r = 0; r < size.height; ++r) {
    for (int c = 0; c < size.width; ++c) {
      double xc = 0.;
      double yc = 0.;
      double zc = 0.;

      if (mode == RECT_PERSPECTIVE) {
        xc = MatRowMul(Ki, c, r, 1., 0);
        yc = MatRowMul(Ki, c, r, 1., 1);
        zc = MatRowMul(Ki, c, r, 1., 2);
      }

      if (mode == RECT_CYLINDRICAL) {
        double tt = MatRowMul(Ki, c, r, 1., 0);
        double pp = MatRowMul(Ki, c, r, 1., 1) + MARGIN;

        xc = -sin(pp) * cos(tt);
        yc = -cos(pp);
        zc =  sin(pp) * sin(tt);
      }

      if (mode == RECT_FISHEYE) {
        if (hypot(c - Knew.at<double>(0, 2), r - Knew.at<double>(1, 2))
            > Knew.at<double>(0, 0)) {
          map1.at<float>(r,c) = -1.f;
          map2.at<float>(r,c) = -1.f;
          continue;
        }
        double ee = MatRowMul(Ki, c, r, 1., 0);
        double ff = MatRowMul(Ki, c, r, 1., 1);

        double zz = 2. / (ee * ee + ff * ff + 1.);

        xc = zz * ee;
        yc = zz * ff;
        zc = zz - 1.;
      }

      if (mode == RECT_LONGLAT) {
        double tt = MatRowMul(Ki, c, r, 1., 0);
        double pp = MatRowMul(Ki, c, r, 1., 1);

        xc = -cos(tt);
        yc = -sin(tt) * cos(pp);
        zc =  sin(tt) * sin(pp);
      }

      double rr = sqrt(xc * xc + yc * yc + zc * zc);
      double xs = xc / rr;
      double ys = yc / rr;
      double zs = zc / rr;

      double xu = xs / (zs + xi);
      double yu = ys / (zs + xi);

      double r2 = xu * xu + yu * yu;
      double r4 = r2 * r2;
      double xd = (1+k1*r2+k2*r4)*xu + 2*p1*xu*yu + p2*(r2+2*xu*xu);
      double yd = (1+k1*r2+k2*r4)*yu + 2*p2*xu*yu + p1*(r2+2*yu*yu);

      double u = fx * xd + s * yd + cx;
      double v = fy * yd + cy;

      map1.at<float>(r,c) = (float) u;
      map2.at<float>(r,c) = (float) v;
    }
  }
}